

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void write_buffer_8x8(__m128i *res,int32_t *output)

{
  longlong lVar1;
  int32_t *output_local;
  __m128i *res_local;
  
  lVar1 = (*res)[1];
  *(longlong *)output = (*res)[0];
  *(longlong *)(output + 2) = lVar1;
  lVar1 = res[1][1];
  *(longlong *)(output + 4) = res[1][0];
  *(longlong *)(output + 6) = lVar1;
  lVar1 = res[2][1];
  *(longlong *)(output + 8) = res[2][0];
  *(longlong *)(output + 10) = lVar1;
  lVar1 = res[3][1];
  *(longlong *)(output + 0xc) = res[3][0];
  *(longlong *)(output + 0xe) = lVar1;
  lVar1 = res[4][1];
  *(longlong *)(output + 0x10) = res[4][0];
  *(longlong *)(output + 0x12) = lVar1;
  lVar1 = res[5][1];
  *(longlong *)(output + 0x14) = res[5][0];
  *(longlong *)(output + 0x16) = lVar1;
  lVar1 = res[6][1];
  *(longlong *)(output + 0x18) = res[6][0];
  *(longlong *)(output + 0x1a) = lVar1;
  lVar1 = res[7][1];
  *(longlong *)(output + 0x1c) = res[7][0];
  *(longlong *)(output + 0x1e) = lVar1;
  lVar1 = res[8][1];
  *(longlong *)(output + 0x20) = res[8][0];
  *(longlong *)(output + 0x22) = lVar1;
  lVar1 = res[9][1];
  *(longlong *)(output + 0x24) = res[9][0];
  *(longlong *)(output + 0x26) = lVar1;
  lVar1 = res[10][1];
  *(longlong *)(output + 0x28) = res[10][0];
  *(longlong *)(output + 0x2a) = lVar1;
  lVar1 = res[0xb][1];
  *(longlong *)(output + 0x2c) = res[0xb][0];
  *(longlong *)(output + 0x2e) = lVar1;
  lVar1 = res[0xc][1];
  *(longlong *)(output + 0x30) = res[0xc][0];
  *(longlong *)(output + 0x32) = lVar1;
  lVar1 = res[0xd][1];
  *(longlong *)(output + 0x34) = res[0xd][0];
  *(longlong *)(output + 0x36) = lVar1;
  lVar1 = res[0xe][1];
  *(longlong *)(output + 0x38) = res[0xe][0];
  *(longlong *)(output + 0x3a) = lVar1;
  lVar1 = res[0xf][1];
  *(longlong *)(output + 0x3c) = res[0xf][0];
  *(longlong *)(output + 0x3e) = lVar1;
  return;
}

Assistant:

static void write_buffer_8x8(__m128i *in, uint16_t *output, int stride,
                             int fliplr, int flipud, int shift, int bd) {
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;

  round_shift_8x8(in, shift);

  v0 = _mm_load_si128((__m128i const *)(output + 0 * stride));
  v1 = _mm_load_si128((__m128i const *)(output + 1 * stride));
  v2 = _mm_load_si128((__m128i const *)(output + 2 * stride));
  v3 = _mm_load_si128((__m128i const *)(output + 3 * stride));
  v4 = _mm_load_si128((__m128i const *)(output + 4 * stride));
  v5 = _mm_load_si128((__m128i const *)(output + 5 * stride));
  v6 = _mm_load_si128((__m128i const *)(output + 6 * stride));
  v7 = _mm_load_si128((__m128i const *)(output + 7 * stride));

  if (flipud) {
    u0 = get_recon_8x8(v0, in[14], in[15], fliplr, bd);
    u1 = get_recon_8x8(v1, in[12], in[13], fliplr, bd);
    u2 = get_recon_8x8(v2, in[10], in[11], fliplr, bd);
    u3 = get_recon_8x8(v3, in[8], in[9], fliplr, bd);
    u4 = get_recon_8x8(v4, in[6], in[7], fliplr, bd);
    u5 = get_recon_8x8(v5, in[4], in[5], fliplr, bd);
    u6 = get_recon_8x8(v6, in[2], in[3], fliplr, bd);
    u7 = get_recon_8x8(v7, in[0], in[1], fliplr, bd);
  } else {
    u0 = get_recon_8x8(v0, in[0], in[1], fliplr, bd);
    u1 = get_recon_8x8(v1, in[2], in[3], fliplr, bd);
    u2 = get_recon_8x8(v2, in[4], in[5], fliplr, bd);
    u3 = get_recon_8x8(v3, in[6], in[7], fliplr, bd);
    u4 = get_recon_8x8(v4, in[8], in[9], fliplr, bd);
    u5 = get_recon_8x8(v5, in[10], in[11], fliplr, bd);
    u6 = get_recon_8x8(v6, in[12], in[13], fliplr, bd);
    u7 = get_recon_8x8(v7, in[14], in[15], fliplr, bd);
  }

  _mm_store_si128((__m128i *)(output + 0 * stride), u0);
  _mm_store_si128((__m128i *)(output + 1 * stride), u1);
  _mm_store_si128((__m128i *)(output + 2 * stride), u2);
  _mm_store_si128((__m128i *)(output + 3 * stride), u3);
  _mm_store_si128((__m128i *)(output + 4 * stride), u4);
  _mm_store_si128((__m128i *)(output + 5 * stride), u5);
  _mm_store_si128((__m128i *)(output + 6 * stride), u6);
  _mm_store_si128((__m128i *)(output + 7 * stride), u7);
}